

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPolygonOffsetTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::PositionColorShader::PositionColorShader
          (PositionColorShader *this)

{
  ShaderProgramDeclaration *pSVar1;
  allocator<char> local_240;
  allocator<char> local_23f;
  allocator<char> local_23e;
  allocator<char> local_23d;
  FragmentOutput local_23c;
  string local_238 [32];
  FragmentSource local_218;
  string local_1f8 [32];
  VertexSource local_1d8;
  string local_1b8 [32];
  string local_198 [32];
  VertexToFragmentVarying local_178;
  VertexAttribute local_170;
  VertexAttribute local_148;
  ShaderProgramDeclaration local_120;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_120);
  std::__cxx11::string::string<std::allocator<char>>(local_198,"a_position",&local_23d);
  std::__cxx11::string::string((string *)&local_148,local_198);
  local_148.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_120,&local_148);
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"a_color",&local_23e);
  std::__cxx11::string::string((string *)&local_170,local_1b8);
  local_170.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_170);
  local_178.type = GENERICVECTYPE_FLOAT;
  local_178.flatshade = false;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_178);
  local_23c.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_23c);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_color;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n}\n"
             ,&local_23f);
  std::__cxx11::string::string((string *)&local_1d8,local_1f8);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_238,
             "varying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_FragColor = v_color;\n}\n",
             &local_240);
  std::__cxx11::string::string((string *)&local_218,local_238);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_218);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string(local_198);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_120);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e21db8;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e21df0;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e21e08;
  return;
}

Assistant:

PositionColorShader::PositionColorShader (void)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_color", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexSource(s_shaderSourceVertex)
							<< sglr::pdec::FragmentSource(s_shaderSourceFragment))
{
}